

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

intmatrix sptk::swipe::zeroim(int xSz,int ySz)

{
  int **ppiVar1;
  int *piVar2;
  ulong uVar3;
  intmatrix iVar4;
  
  ppiVar1 = (int **)malloc((long)xSz * 8);
  if (0 < xSz) {
    uVar3 = 0;
    do {
      piVar2 = (int *)malloc((long)xSz << 2);
      ppiVar1[uVar3] = piVar2;
      uVar3 = uVar3 + 1;
    } while ((uint)xSz != uVar3);
  }
  iVar4.y = ySz;
  iVar4.x = xSz;
  iVar4.m = ppiVar1;
  return iVar4;
}

Assistant:

intmatrix zeroim(int xSz, int ySz) {
    intmatrix nw_matrix;
    nw_matrix.x = xSz;
    nw_matrix.y = ySz;
#if 0
    nw_matrix.m = malloc(sizeof(int) * xSz);
#else
    nw_matrix.m = (int**) malloc(sizeof(int*) * xSz);
#endif
    int i;
    for (i = 0; i < nw_matrix.x; i++)
#if 0
        nw_matrix.m[i] = calloc(sizeof(int), ySz);
#else
        nw_matrix.m[i] = (int*) malloc(sizeof(int) * xSz);
#endif
    return(nw_matrix);
}